

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_ntlm.c
# Opt level: O1

char * printable(char *inbuf,size_t inlength)

{
  char cVar1;
  size_t sVar2;
  char *buffer;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  char *__ptr;
  size_t __size;
  ulong local_40;
  
  sVar2 = strlen(inbuf);
  if (sVar2 == 0) {
    __size = 10;
    local_40 = 0;
  }
  else {
    local_40 = 7;
    if (7 < sVar2 >> 1) {
      local_40 = sVar2 >> 1;
    }
    __size = local_40 + sVar2;
  }
  buffer = (char *)malloc(__size);
  if (buffer == (char *)0x0) {
LAB_00105675:
    buffer = (char *)0x0;
  }
  else if (sVar2 == 0) {
    curl_msnprintf(buffer,__size,"%s","[NOTHING]");
  }
  else {
    uVar5 = 0;
    sVar4 = 0;
    __ptr = buffer;
    do {
      buffer = __ptr;
      if (__size - 7 < uVar5) {
        __size = __size + local_40;
        buffer = (char *)realloc(__ptr,__size);
        if (buffer == (char *)0x0) {
          free(__ptr);
          goto LAB_00105675;
        }
      }
      cVar1 = inbuf[sVar4];
      if ((byte)(cVar1 + 0x81U) < 0xa2) {
        curl_msnprintf(buffer + uVar5,__size - uVar5,"[0x%02X]",(ulong)(uint)(int)cVar1);
        lVar3 = 6;
      }
      else {
        buffer[uVar5] = cVar1;
        lVar3 = 1;
      }
      uVar5 = uVar5 + lVar3;
      sVar4 = sVar4 + 1;
      __ptr = buffer;
    } while (sVar2 != sVar4);
    buffer[uVar5] = '\0';
  }
  return buffer;
}

Assistant:

static char *printable(char *inbuf, size_t inlength)
{
  char *outbuf;
  char *newbuf;
  size_t newsize;
  size_t outsize;
  size_t outincr = 0;
  size_t i, o = 0;

#define HEX_FMT_STR  "[0x%02X]"
#define HEX_STR_LEN  6
#define NOTHING_STR  "[NOTHING]"
#define NOTHING_LEN  9

  if(!inlength)
    inlength = strlen(inbuf);

  if(inlength) {
    outincr = ((inlength/2) < (HEX_STR_LEN + 1)) ?
      HEX_STR_LEN + 1 : inlength/2;
    outsize = inlength + outincr;
  }
  else
    outsize = NOTHING_LEN + 1;

  outbuf = malloc(outsize);
  if(!outbuf)
    return NULL;

  if(!inlength) {
    msnprintf(&outbuf[0], outsize, "%s", NOTHING_STR);
    return outbuf;
  }

  for(i = 0; i<inlength; i++) {

    if(o > outsize - (HEX_STR_LEN + 1)) {
      newsize = outsize + outincr;
      newbuf = realloc(outbuf, newsize);
      if(!newbuf) {
        free(outbuf);
        return NULL;
      }
      outbuf = newbuf;
      outsize = newsize;
    }

    if((inbuf[i] > 0x20) && (inbuf[i] < 0x7F)) {
      outbuf[o] = inbuf[i];
      o++;
    }
    else {
      msnprintf(&outbuf[o], outsize - o, HEX_FMT_STR, inbuf[i]);
      o += HEX_STR_LEN;
    }

  }
  outbuf[o] = '\0';

  return outbuf;
}